

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

holder<cs_impl::fiber::Channel<cs_impl::any>_> * __thiscall
cs::
allocator_type<cs_impl::any::holder<cs_impl::fiber::Channel<cs_impl::any>_>,_64UL,_cs_impl::default_allocator_provider>
::alloc<>(allocator_type<cs_impl::any::holder<cs_impl::fiber::Channel<cs_impl::any>_>,_64UL,_cs_impl::default_allocator_provider>
          *this)

{
  _func_int **pp_Var1;
  __int_type _Var2;
  holder<cs_impl::fiber::Channel<cs_impl::any>_> *phVar3;
  holder<cs_impl::fiber::Channel<cs_impl::any>_> *in_RDI;
  new_allocator<cs_impl::any::holder<cs_impl::fiber::Channel<cs_impl::any>_>_> *unaff_retaddr;
  holder<cs_impl::fiber::Channel<cs_impl::any>_> *ptr;
  void *pvVar4;
  
  pvVar4 = (void *)0x0;
  phVar3 = in_RDI;
  if (in_RDI[0xd].super_baseHolder._vptr_baseHolder != (_func_int **)0x0) {
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_long
                      ((__atomic_base<unsigned_long> *)in_RDI);
    if (_Var2 == 0) {
      pp_Var1 = in_RDI[0xd].super_baseHolder._vptr_baseHolder;
      in_RDI[0xd].super_baseHolder._vptr_baseHolder = (_func_int **)((long)pp_Var1 - 1);
      phVar3 = *(holder<cs_impl::fiber::Channel<cs_impl::any>_> **)
                ((long)in_RDI + (long)pp_Var1 * 8 + -8);
      goto LAB_002bf50a;
    }
  }
  phVar3 = __gnu_cxx::new_allocator<cs_impl::any::holder<cs_impl::fiber::Channel<cs_impl::any>_>_>::
           allocate(unaff_retaddr,(size_type)phVar3,pvVar4);
LAB_002bf50a:
  __gnu_cxx::new_allocator<cs_impl::any::holder<cs_impl::fiber::Channel<cs_impl::any>>>::
  construct<cs_impl::any::holder<cs_impl::fiber::Channel<cs_impl::any>>>
            ((new_allocator<cs_impl::any::holder<cs_impl::fiber::Channel<cs_impl::any>_>_> *)phVar3,
             in_RDI);
  return phVar3;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}